

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace-type-impl.cpp
# Opt level: O0

void __thiscall yactfr::internal::TraceTypeImpl::_setDispNames(TraceTypeImpl *this)

{
  bool bVar1;
  pointer this_00;
  reference this_01;
  pointer pDVar2;
  StructureType *pSVar3;
  EventRecordTypeSet *this_02;
  reference this_03;
  pointer pEVar4;
  socklen_t *in_RCX;
  sockaddr *__addr;
  sockaddr *__addr_00;
  sockaddr *__addr_01;
  sockaddr *__addr_02;
  sockaddr *__addr_03;
  sockaddr *__addr_04;
  unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>
  *ert;
  iterator __end3;
  iterator __begin3;
  EventRecordTypeSet *__range3;
  unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_> *dst;
  iterator __end2;
  iterator __begin2;
  DataStreamTypeSet *__range2;
  undefined1 local_20 [8];
  SetDispNamesDtVisitor visitor;
  TraceTypeImpl *this_local;
  
  visitor._8_8_ = this;
  SetDispNamesDtVisitor::SetDispNamesDtVisitor
            ((SetDispNamesDtVisitor *)local_20,this->_majorVersion == 1);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->_pktHeaderType);
  if (bVar1) {
    this_00 = std::
              unique_ptr<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>
              ::operator->(&this->_pktHeaderType);
    DataType::accept((DataType *)this_00,(int)local_20,__addr,in_RCX);
  }
  __end2 = std::
           set<std::unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>,_yactfr::internal::DstIdComp,_std::allocator<std::unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>_>_>
           ::begin(&this->_dsts);
  dst = (unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>
         *)std::
           set<std::unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>,_yactfr::internal::DstIdComp,_std::allocator<std::unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>_>_>
           ::end(&this->_dsts);
  while (bVar1 = std::operator!=(&__end2,(_Self *)&dst), bVar1) {
    this_01 = std::
              _Rb_tree_const_iterator<std::unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>_>
              ::operator*(&__end2);
    pDVar2 = std::
             unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>
             ::operator->(this_01);
    pSVar3 = DataStreamType::packetContextType(pDVar2);
    if (pSVar3 != (StructureType *)0x0) {
      pDVar2 = std::
               unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>
               ::operator->(this_01);
      pSVar3 = DataStreamType::packetContextType(pDVar2);
      DataType::accept((DataType *)pSVar3,(int)local_20,__addr_00,in_RCX);
    }
    pDVar2 = std::
             unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>
             ::operator->(this_01);
    pSVar3 = DataStreamType::eventRecordHeaderType(pDVar2);
    if (pSVar3 != (StructureType *)0x0) {
      pDVar2 = std::
               unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>
               ::operator->(this_01);
      pSVar3 = DataStreamType::eventRecordHeaderType(pDVar2);
      DataType::accept((DataType *)pSVar3,(int)local_20,__addr_01,in_RCX);
    }
    pDVar2 = std::
             unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>
             ::operator->(this_01);
    pSVar3 = DataStreamType::eventRecordCommonContextType(pDVar2);
    if (pSVar3 != (StructureType *)0x0) {
      pDVar2 = std::
               unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>
               ::operator->(this_01);
      pSVar3 = DataStreamType::eventRecordCommonContextType(pDVar2);
      DataType::accept((DataType *)pSVar3,(int)local_20,__addr_02,in_RCX);
    }
    pDVar2 = std::
             unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>
             ::operator->(this_01);
    this_02 = DataStreamType::eventRecordTypes(pDVar2);
    __end3 = std::
             set<std::unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>,_yactfr::internal::ErtIdComp,_std::allocator<std::unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>_>_>
             ::begin(this_02);
    ert = (unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>
           *)std::
             set<std::unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>,_yactfr::internal::ErtIdComp,_std::allocator<std::unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>_>_>
             ::end(this_02);
    while (bVar1 = std::operator!=(&__end3,(_Self *)&ert), bVar1) {
      this_03 = std::
                _Rb_tree_const_iterator<std::unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>_>
                ::operator*(&__end3);
      pEVar4 = std::
               unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>
               ::operator->(this_03);
      pSVar3 = EventRecordType::specificContextType(pEVar4);
      if (pSVar3 != (StructureType *)0x0) {
        pEVar4 = std::
                 unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>
                 ::operator->(this_03);
        pSVar3 = EventRecordType::specificContextType(pEVar4);
        DataType::accept((DataType *)pSVar3,(int)local_20,__addr_03,in_RCX);
      }
      pEVar4 = std::
               unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>
               ::operator->(this_03);
      pSVar3 = EventRecordType::payloadType(pEVar4);
      if (pSVar3 != (StructureType *)0x0) {
        pEVar4 = std::
                 unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>
                 ::operator->(this_03);
        pSVar3 = EventRecordType::payloadType(pEVar4);
        DataType::accept((DataType *)pSVar3,(int)local_20,__addr_04,in_RCX);
      }
      std::
      _Rb_tree_const_iterator<std::unique_ptr<const_yactfr::EventRecordType,_std::default_delete<const_yactfr::EventRecordType>_>_>
      ::operator++(&__end3);
    }
    std::
    _Rb_tree_const_iterator<std::unique_ptr<const_yactfr::DataStreamType,_std::default_delete<const_yactfr::DataStreamType>_>_>
    ::operator++(&__end2);
  }
  SetDispNamesDtVisitor::~SetDispNamesDtVisitor((SetDispNamesDtVisitor *)local_20);
  return;
}

Assistant:

void TraceTypeImpl::_setDispNames() const
{
    SetDispNamesDtVisitor visitor {_majorVersion == 1};

    if (_pktHeaderType) {
        _pktHeaderType->accept(visitor);
    }

    for (auto& dst : _dsts) {
        if (dst->packetContextType()) {
            dst->packetContextType()->accept(visitor);
        }

        if (dst->eventRecordHeaderType()) {
            dst->eventRecordHeaderType()->accept(visitor);
        }

        if (dst->eventRecordCommonContextType()) {
            dst->eventRecordCommonContextType()->accept(visitor);
        }

        for (auto& ert : dst->eventRecordTypes()) {
            if (ert->specificContextType()) {
                ert->specificContextType()->accept(visitor);
            }

            if (ert->payloadType()) {
                ert->payloadType()->accept(visitor);
            }
        }
    }
}